

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
HdlcSimulationDataGenerator::CreateAsyncByte(HdlcSimulationDataGenerator *this,U8 byte)

{
  int iVar1;
  int iVar2;
  uint local_24;
  BitState bit;
  U32 i;
  BitExtractor bit_extractor;
  U8 byte_local;
  HdlcSimulationDataGenerator *this_local;
  
  iVar2 = SimulationChannelDescriptor::GetCurrentBitState();
  iVar1 = (int)this;
  if (iVar2 == 0) {
    SimulationChannelDescriptor::Transition();
    SimulationChannelDescriptor::Advance(iVar1 + 0x48);
  }
  SimulationChannelDescriptor::TransitionIfNeeded(iVar1 + 0x48);
  SimulationChannelDescriptor::Advance(iVar1 + 0x48);
  BitExtractor::BitExtractor((BitExtractor *)&bit,(ulong)byte,LsbFirst,8);
  for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
    BitExtractor::GetNextBit();
    SimulationChannelDescriptor::TransitionIfNeeded(iVar1 + 0x48);
    SimulationChannelDescriptor::Advance(iVar1 + 0x48);
  }
  SimulationChannelDescriptor::TransitionIfNeeded(iVar1 + 0x48);
  SimulationChannelDescriptor::Advance(iVar1 + 0x48);
  BitExtractor::~BitExtractor((BitExtractor *)&bit);
  return;
}

Assistant:

void HdlcSimulationDataGenerator::CreateAsyncByte( U8 byte )
{
    // 0) If the line is not high we must set it high
    if( mHdlcSimulationData.GetCurrentBitState() == BIT_LOW )
    {
        mHdlcSimulationData.Transition();
        mHdlcSimulationData.Advance( mSamplesInHalfPeriod );
    }

    // 1) Start bit (BIT_HIGH -> BIT_LOW)
    mHdlcSimulationData.TransitionIfNeeded( BIT_LOW );
    mHdlcSimulationData.Advance( mSamplesInHalfPeriod );

    // 2) Transmit byte
    BitExtractor bit_extractor( byte, AnalyzerEnums::LsbFirst, 8 );
    for( U32 i = 0; i < 8; ++i )
    {
        BitState bit = bit_extractor.GetNextBit();
        mHdlcSimulationData.TransitionIfNeeded( bit );
        mHdlcSimulationData.Advance( mSamplesInHalfPeriod );
    }

    // 3) Stop bit (BIT_LOW -> BIT_HIGH)
    mHdlcSimulationData.TransitionIfNeeded( BIT_HIGH );
    mHdlcSimulationData.Advance( mSamplesInHalfPeriod );
}